

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::Generate
          (SharedCodeGenerator *this,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_file_list)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ClassNameResolver *this_00;
  scoped_ptr<google::protobuf::io::Printer> printer_00;
  int iVar2;
  long *plVar3;
  undefined4 extraout_var;
  ZeroCopyOutputStream *output_00;
  size_type *psVar4;
  AnnotationCollector *annotation_collector_00;
  char *__function;
  scoped_ptr<google::protobuf::io::Printer> printer;
  string info_full_path;
  string info_relative_path;
  string filename;
  string classname;
  string java_package;
  GeneratedCodeInfo annotations;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  string package_dir;
  scoped_ptr<google::protobuf::io::Printer> local_178;
  value_type local_170;
  long *local_150;
  long local_148;
  long local_140 [2];
  value_type local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [48];
  AnnotationCollector local_60;
  GeneratedCodeInfo *local_58;
  string local_50;
  ZeroCopyOutputStream *output;
  undefined4 extraout_var_00;
  
  FileJavaPackage_abi_cxx11_
            (&local_b0,(java *)this->file_,(FileDescriptor *)0x1,SUB81(annotation_file_list,0));
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  JavaPackageToDir(&local_50,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (((this->options_).enforce_lite != false) ||
     (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) == 3)) goto LAB_0027aafd;
  this_00 = (this->name_resolver_).ptr_;
  if (this_00 == (ClassNameResolver *)0x0) {
    __function = 
    "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ClassNameResolver>::operator->() const [C = google::protobuf::compiler::java::ClassNameResolver]"
    ;
    goto LAB_0027ab66;
  }
  ClassNameResolver::GetDescriptorClassName_abi_cxx11_(&local_110,this_00,this->file_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &local_50,&local_110);
  plVar3 = (long *)std::__cxx11::string::append(local_90);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_130.field_2._M_allocated_capacity = *psVar4;
    local_130.field_2._8_8_ = plVar3[3];
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar4;
    local_130._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_130._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(file_list,&local_130);
  iVar2 = (*context->_vptr_GeneratorContext[2])(context,&local_130);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_90);
  local_60._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_00425e08;
  local_58 = (GeneratedCodeInfo *)local_90;
  local_178.ptr_ = (Printer *)operator_new(0x88);
  annotation_collector_00 = &local_60;
  if ((this->options_).annotate_code == false) {
    annotation_collector_00 = (AnnotationCollector *)0x0;
  }
  io::Printer::Printer(local_178.ptr_,output,'$',annotation_collector_00);
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_110._M_dataplus._M_p,
             local_110._M_dataplus._M_p + local_110._M_string_length);
  std::__cxx11::string::append((char *)&local_150);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_130._M_dataplus._M_p,
             local_130._M_dataplus._M_p + local_130._M_string_length);
  std::__cxx11::string::append((char *)&local_170);
  if (local_178.ptr_ != (Printer *)0x0) {
    io::Printer::Print(local_178.ptr_,
                       "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                       ,"filename",*(string **)this->file_);
    if (local_b0._M_string_length != 0) {
      if (local_178.ptr_ == (Printer *)0x0) goto LAB_0027ab51;
      io::Printer::Print(local_178.ptr_,"package $package$;\n\n","package",&local_b0);
    }
    printer_00.ptr_ = local_178.ptr_;
    paVar1 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    if ((this->options_).annotate_code == true) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_150,local_148 + (long)local_150);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    }
    PrintGeneratedAnnotation(printer_00.ptr_,'$',&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_178.ptr_ != (Printer *)0x0) {
      io::Printer::Print(local_178.ptr_,
                         "public final class $classname$ {\n  public static com.google.protobuf.Descriptors.FileDescriptor\n      descriptor;\n  static {\n"
                         ,"classname",&local_110);
      if (local_178.ptr_ != (Printer *)0x0) {
        io::Printer::Annotate(local_178.ptr_,"classname","classname",*(string **)this->file_);
        if (local_178.ptr_ != (Printer *)0x0) {
          io::Printer::Indent(local_178.ptr_);
          if (local_178.ptr_ != (Printer *)0x0) {
            io::Printer::Indent(local_178.ptr_);
            GenerateDescriptors(this,local_178.ptr_);
            if (local_178.ptr_ != (Printer *)0x0) {
              io::Printer::Outdent(local_178.ptr_);
              if (local_178.ptr_ != (Printer *)0x0) {
                io::Printer::Outdent(local_178.ptr_);
                if (local_178.ptr_ != (Printer *)0x0) {
                  io::Printer::Print(local_178.ptr_,"  }\n}\n");
                  if ((this->options_).annotate_code == true) {
                    iVar2 = (*context->_vptr_GeneratorContext[2])(context,&local_170);
                    output_00 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar2);
                    MessageLite::SerializeToZeroCopyStream((MessageLite *)local_90,output_00);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(annotation_file_list,&local_170);
                    if (output_00 != (ZeroCopyOutputStream *)0x0) {
                      (*output_00->_vptr_ZeroCopyOutputStream[1])(output_00);
                    }
                  }
                  internal::scoped_ptr<google::protobuf::io::Printer>::reset
                            (&local_178,(Printer *)0x0);
                  if (output != (ZeroCopyOutputStream *)0x0) {
                    (*output->_vptr_ZeroCopyOutputStream[1])(output);
                    output = (ZeroCopyOutputStream *)0x0;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_170._M_dataplus._M_p != &local_170.field_2) {
                    operator_delete(local_170._M_dataplus._M_p,
                                    local_170.field_2._M_allocated_capacity + 1);
                  }
                  if (local_150 != local_140) {
                    operator_delete(local_150,local_140[0] + 1);
                  }
                  internal::scoped_ptr<google::protobuf::io::Printer>::~scoped_ptr(&local_178);
                  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_90);
                  if (output != (ZeroCopyOutputStream *)0x0) {
                    (*output->_vptr_ZeroCopyOutputStream[1])(output);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_130._M_dataplus._M_p != &local_130.field_2) {
                    operator_delete(local_130._M_dataplus._M_p,
                                    local_130.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_110._M_dataplus._M_p != &local_110.field_2) {
                    operator_delete(local_110._M_dataplus._M_p,
                                    local_110.field_2._M_allocated_capacity + 1);
                  }
LAB_0027aafd:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_50._M_dataplus._M_p != &local_50.field_2) {
                    operator_delete(local_50._M_dataplus._M_p,
                                    local_50.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p,
                                    local_b0.field_2._M_allocated_capacity + 1);
                  }
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0027ab51:
  __function = 
  "C *google::protobuf::internal::scoped_ptr<google::protobuf::io::Printer>::operator->() const [C = google::protobuf::io::Printer]"
  ;
LAB_0027ab66:
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,__function);
}

Assistant:

void SharedCodeGenerator::Generate(GeneratorContext* context,
                                   std::vector<string>* file_list,
                                   std::vector<string>* annotation_file_list) {
  string java_package = FileJavaPackage(file_);
  string package_dir = JavaPackageToDir(java_package);

  if (HasDescriptorMethods(file_, options_.enforce_lite)) {
    // Generate descriptors.
    string classname = name_resolver_->GetDescriptorClassName(file_);
    string filename = package_dir + classname + ".java";
    file_list->push_back(filename);
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    google::protobuf::scoped_ptr<io::Printer> printer(
        new io::Printer(output.get(), '$',
                        options_.annotate_code ? &annotation_collector : NULL));
    string info_relative_path = classname + ".java.pb.meta";
    string info_full_path = filename + ".pb.meta";
    printer->Print(
        "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
        "// source: $filename$\n"
        "\n",
        "filename", file_->name());
    if (!java_package.empty()) {
      printer->Print(
        "package $package$;\n"
        "\n",
        "package", java_package);
    }
    PrintGeneratedAnnotation(printer.get(), '$',
                             options_.annotate_code ? info_relative_path : "");
    printer->Print(
        "public final class $classname$ {\n"
        "  public static com.google.protobuf.Descriptors.FileDescriptor\n"
        "      descriptor;\n"
        "  static {\n",
        "classname", classname);
    printer->Annotate("classname", file_->name());
    printer->Indent();
    printer->Indent();
    GenerateDescriptors(printer.get());
    printer->Outdent();
    printer->Outdent();
    printer->Print(
      "  }\n"
      "}\n");

    if (options_.annotate_code) {
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
      annotation_file_list->push_back(info_full_path);
    }

    printer.reset();
    output.reset();
  }
}